

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O1

ArgumentAndValue * __thiscall
juzzlin::Argengine::Impl::splitAssignmentFormat
          (ArgumentAndValue *__return_storage_ptr__,Impl *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  OptionDefinitionSP match;
  string assignmentFormatArg;
  undefined1 local_80 [16];
  _Alloc_hider local_70;
  _Alloc_hider local_68;
  size_type local_60;
  undefined1 auStack_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  lVar2 = std::__cxx11::string::find((char)arg,0x3d);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)arg);
    std::__cxx11::string::operator=((string *)(auStack_58 + 8),(string *)&local_70);
    if ((size_type *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60 + 1);
    }
    getOptionDefinition((Impl *)local_80,(string *)this);
    if (((pointer)local_80._0_8_ != (pointer)0x0) &&
       ((((pointer)(local_80._0_8_ + 0x60))->_M_dataplus)._M_p != (pointer)0x0)) {
      if (arg->_M_string_length == lVar2 + 1U) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[1],_true>
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (auStack_58 + 8),(char (*) [1])0x1110fd);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)arg);
        (__return_storage_ptr__->first)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->first).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_50._M_dataplus._M_p,
                   local_50._M_string_length + (long)local_50._M_dataplus._M_p);
        paVar1 = &(__return_storage_ptr__->second).field_2;
        (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
        if ((size_type *)local_70._M_p == &local_60) {
          paVar1->_M_allocated_capacity = local_60;
          *(undefined1 (*) [8])((long)&(__return_storage_ptr__->second).field_2 + 8) = auStack_58;
        }
        else {
          (__return_storage_ptr__->second)._M_dataplus._M_p = local_70._M_p;
          (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_60;
        }
        (__return_storage_ptr__->second)._M_string_length = (size_type)local_68._M_p;
      }
      if ((pointer)local_80._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
      }
      goto LAB_0010e67d;
    }
    if ((pointer)local_80._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
    }
  }
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
LAB_0010e67d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ArgumentAndValue splitAssignmentFormat(const std::string & arg) const
    {
        std::string assignmentFormatArg;
        if (const auto pos = arg.find('='); pos != arg.npos) {
            assignmentFormatArg = arg.substr(0, pos);
            if (const auto match = getOptionDefinition(assignmentFormatArg); match && match->singleStringCallback) {
                if (const auto valueLength = arg.size() - (pos + 1); !valueLength) {
                    return { assignmentFormatArg, "" };
                } else {
                    return { assignmentFormatArg, arg.substr(pos + 1, valueLength) };
                }
            }
        }
        return {};
    }